

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot.cpp
# Opt level: O3

void ImPlot::SetPlotYAxis(ImPlotYAxis y_axis)

{
  if (GImPlot->CurrentPlot == (ImPlotPlot *)0x0) {
    __assert_fail("(gp.CurrentPlot != __null) && \"SetPlotYAxis() needs to be called between BeginPlot() and EndPlot()!\""
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                  ,0xa55,"void ImPlot::SetPlotYAxis(ImPlotYAxis)");
  }
  if ((uint)y_axis < 3) {
    GImPlot->CurrentPlot->CurrentYAxis = y_axis;
    return;
  }
  __assert_fail("(y_axis >= 0 && y_axis < 3) && \"y_axis needs to be between 0 and IMPLOT_Y_AXES\"",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/implot.cpp"
                ,0xa56,"void ImPlot::SetPlotYAxis(ImPlotYAxis)");
}

Assistant:

void SetPlotYAxis(ImPlotYAxis y_axis) {
    ImPlotContext& gp = *GImPlot;
    IM_ASSERT_USER_ERROR(gp.CurrentPlot != NULL, "SetPlotYAxis() needs to be called between BeginPlot() and EndPlot()!");
    IM_ASSERT_USER_ERROR(y_axis >= 0 && y_axis < IMPLOT_Y_AXES, "y_axis needs to be between 0 and IMPLOT_Y_AXES");
    gp.CurrentPlot->CurrentYAxis = y_axis;
}